

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1501.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  ssize_t sznum;
  timeval tVar10;
  timeval tVar11;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1d0 = 0;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                  ,0x3c,iVar1,uVar2);
    goto LAB_001023ba;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                  ,0x3e);
    iVar1 = 0x7c;
    goto LAB_001023a5;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uVar7 = 0x41;
      goto LAB_00102398;
    }
    lVar4 = curl_multi_init();
    if (lVar4 != 0) {
      iVar1 = curl_multi_add_handle(lVar4,lVar3);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_multi_perform(lVar4,&local_1d0);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          if (local_1d0 < 0) {
            pcVar9 = 
            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
            ;
            uVar8 = 0x47;
LAB_0010270c:
            curl_mfprintf(_stderr,pcVar9,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                          ,uVar8);
            iVar1 = 0x7a;
          }
          else {
            tVar10 = tutil_tvnow();
            lVar5 = tutil_tvdiff(tVar10,tv_test_start);
            if (lVar5 < 0x7531) {
              if (local_1d0 == 0) {
                iVar1 = 0;
              }
              else {
                do {
                  local_1cc = -99;
                  local_1c8.tv_sec = 0;
                  local_1c8.tv_usec = 100000;
                  local_b8.__fds_bits[0] = 0;
                  local_b8.__fds_bits[1] = 0;
                  local_b8.__fds_bits[2] = 0;
                  local_b8.__fds_bits[3] = 0;
                  local_b8.__fds_bits[4] = 0;
                  local_b8.__fds_bits[5] = 0;
                  local_b8.__fds_bits[6] = 0;
                  local_b8.__fds_bits[7] = 0;
                  local_b8.__fds_bits[8] = 0;
                  local_b8.__fds_bits[9] = 0;
                  local_b8.__fds_bits[10] = 0;
                  local_b8.__fds_bits[0xb] = 0;
                  local_b8.__fds_bits[0xc] = 0;
                  local_b8.__fds_bits[0xd] = 0;
                  local_b8.__fds_bits[0xe] = 0;
                  local_b8.__fds_bits[0xf] = 0;
                  local_138.__fds_bits[0] = 0;
                  local_138.__fds_bits[1] = 0;
                  local_138.__fds_bits[2] = 0;
                  local_138.__fds_bits[3] = 0;
                  local_138.__fds_bits[4] = 0;
                  local_138.__fds_bits[5] = 0;
                  local_138.__fds_bits[6] = 0;
                  local_138.__fds_bits[7] = 0;
                  local_138.__fds_bits[8] = 0;
                  local_138.__fds_bits[9] = 0;
                  local_138.__fds_bits[10] = 0;
                  local_138.__fds_bits[0xb] = 0;
                  local_138.__fds_bits[0xc] = 0;
                  local_138.__fds_bits[0xd] = 0;
                  local_138.__fds_bits[0xe] = 0;
                  local_138.__fds_bits[0xf] = 0;
                  local_1b8.__fds_bits[0xe] = 0;
                  local_1b8.__fds_bits[0xf] = 0;
                  local_1b8.__fds_bits[0xc] = 0;
                  local_1b8.__fds_bits[0xd] = 0;
                  local_1b8.__fds_bits[10] = 0;
                  local_1b8.__fds_bits[0xb] = 0;
                  local_1b8.__fds_bits[8] = 0;
                  local_1b8.__fds_bits[9] = 0;
                  local_1b8.__fds_bits[6] = 0;
                  local_1b8.__fds_bits[7] = 0;
                  local_1b8.__fds_bits[4] = 0;
                  local_1b8.__fds_bits[5] = 0;
                  local_1b8.__fds_bits[2] = 0;
                  local_1b8.__fds_bits[3] = 0;
                  local_1b8.__fds_bits[0] = 0;
                  local_1b8.__fds_bits[1] = 0;
                  iVar1 = curl_multi_fdset(lVar4,&local_b8,&local_138,&local_1b8,&local_1cc);
                  uVar8 = _stderr;
                  if (iVar1 != 0) {
                    uVar2 = curl_multi_strerror(iVar1);
                    pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                    uVar7 = 0x5c;
                    goto LAB_00102398;
                  }
                  if (local_1cc < -1) {
                    pcVar9 = 
                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                    uVar8 = 0x5c;
                    goto LAB_0010270c;
                  }
                  iVar1 = select_wrapper(local_1cc + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
                  if (iVar1 == -1) {
                    piVar6 = __errno_location();
                    uVar8 = _stderr;
                    iVar1 = *piVar6;
                    pcVar9 = strerror(iVar1);
                    curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                  ,0x60,iVar1,pcVar9);
                    iVar1 = 0x79;
                    break;
                  }
                  tVar10 = tutil_tvnow();
                  lVar5 = tutil_tvdiff(tVar10,tv_test_start);
                  if (30000 < lVar5) {
                    uVar8 = 0x62;
                    goto LAB_0010273a;
                  }
                  curl_mfprintf(_stderr,"ping\n");
                  tVar10 = tutil_tvnow();
                  iVar1 = curl_multi_perform(lVar4,&local_1d0);
                  uVar8 = _stderr;
                  if (iVar1 != 0) {
                    uVar2 = curl_multi_strerror(iVar1);
                    pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                    uVar7 = 0x67;
                    goto LAB_00102398;
                  }
                  if (local_1d0 < 0) {
                    pcVar9 = 
                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                    ;
                    uVar8 = 0x67;
                    goto LAB_0010270c;
                  }
                  tVar11 = tutil_tvnow();
                  lVar5 = tutil_tvdiff(tVar11,tv_test_start);
                  if (30000 < lVar5) {
                    uVar8 = 0x69;
                    goto LAB_0010273a;
                  }
                  tVar11 = tutil_tvnow();
                  sznum = (tVar11.tv_usec - tVar10.tv_usec) +
                          (tVar11.tv_sec - tVar10.tv_sec) * 1000000;
                  if (sznum < 1) {
                    sznum = 0;
                  }
                  iVar1 = curlx_sztosi(sznum);
                  curl_mfprintf(_stderr,"pong = %d\n",iVar1);
                  if (500000 < iVar1) {
                    iVar1 = 100;
                    break;
                  }
                  iVar1 = 0;
                } while (local_1d0 != 0);
              }
            }
            else {
              uVar8 = 0x49;
LAB_0010273a:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                            ,uVar8);
              iVar1 = 0x7d;
            }
          }
          goto LAB_001023a5;
        }
        uVar2 = curl_multi_strerror(iVar1);
        pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uVar7 = 0x47;
      }
      else {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uVar7 = 0x45;
      }
      goto LAB_00102398;
    }
    lVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                  ,0x43);
    iVar1 = 0x7b;
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar4 = 0;
    uVar7 = 0x40;
LAB_00102398:
    curl_mfprintf(uVar8,pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                  ,uVar7,iVar1,uVar2);
  }
LAB_001023a5:
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_001023ba:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLM *mhandle = NULL;
  int res = 0;
  int still_running = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(handle);

  easy_setopt(handle, CURLOPT_URL, URL);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);

  multi_init(mhandle);

  multi_add_handle(mhandle, handle);

  multi_perform(mhandle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;
    struct timeval before;
    struct timeval after;
    int e;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(mhandle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    fprintf(stderr, "ping\n");
    before = tutil_tvnow();

    multi_perform(mhandle, &still_running);

    abort_on_test_timeout();

    after = tutil_tvnow();
    e = elapsed(&before, &after);
    fprintf(stderr, "pong = %d\n", e);

    if(e > MAX_BLOCKED_TIME_US) {
      res = 100;
      break;
    }
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(mhandle);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}